

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

void __thiscall SQBlob::SQBlob(SQBlob *this,SQInteger size)

{
  uchar *puVar1;
  SQInteger size_local;
  SQBlob *this_local;
  
  SQStream::SQStream(&this->super_SQStream);
  (this->super_SQStream)._vptr_SQStream = (_func_int **)&PTR__SQBlob_00216d20;
  this->_size = size;
  this->_allocated = size;
  puVar1 = (uchar *)sq_malloc(size);
  this->_buf = puVar1;
  memset(this->_buf,0,this->_size);
  this->_ptr = 0;
  this->_owns = true;
  return;
}

Assistant:

SQBlob(SQInteger size) {
        _size = size;
        _allocated = size;
        _buf = (unsigned char *)sq_malloc(size);
        memset(_buf, 0, _size);
        _ptr = 0;
        _owns = true;
    }